

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O2

Relations dg::vr::Relations::getAugmented(Relations rels)

{
  Type type;
  Relations RVar1;
  Type TVar2;
  long lVar3;
  Relations augmented;
  
  augmented.bits.super__Base_bitset<1UL>._M_w = rels.bits.super__Base_bitset<1UL>._M_w;
  for (lVar3 = 0;
      RVar1.bits.super__Base_bitset<1UL>._M_w = augmented.bits.super__Base_bitset<1UL>._M_w,
      lVar3 != 0x30; lVar3 = lVar3 + 4) {
    type = *(Type *)((long)&all + lVar3);
    if ((0x2a8UL >> ((ulong)type & 0x3f) & 1) != 0) {
      TVar2 = getNonStrict(type);
      if (((ulong)RVar1.bits.super__Base_bitset<1UL>._M_w & 1L << ((byte)type & 0x3f)) == 0) {
        if (((ulong)augmented.bits.super__Base_bitset<1UL>._M_w >> ((ulong)TVar2 & 0x3f) & 1) != 0)
        {
          std::bitset<12UL>::set(&augmented.bits,(ulong)type,true);
          eq(&augmented);
        }
      }
      else {
        std::bitset<12UL>::set(&augmented.bits,(ulong)TVar2,true);
      }
    }
  }
  return (Relations)(Relations)augmented.bits.super__Base_bitset<1UL>._M_w;
}

Assistant:

Relations Relations::getAugmented(Relations rels) {
    Relations augmented = rels;
    for (Relations::Type type : Relations::all) {
        if (!strict.has(type))
            continue;

        if (augmented.has(type)) {
            augmented.set(Relations::getNonStrict(type));
        } else if (augmented.has(Relations::getNonStrict(type))) {
            augmented.set(type);
            augmented.eq();
        }
    }
    return augmented;
}